

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O2

uint __thiscall Js::WebAssemblyModule::GetGlobalsByteSize(WebAssemblyModule *this)

{
  bool bVar1;
  uint offset;
  WasmType type;
  WasmType type_00;
  uint32 size;
  
  offset = 0;
  for (type_00 = FirstLocalType; type_00 != Limit; type_00 = type_00 + FirstLocalType) {
    bVar1 = Wasm::WasmTypes::IsLocalType(type_00);
    if (bVar1) {
      offset = AddGlobalByteSizeToOffset(this,type_00,offset);
    }
  }
  return offset;
}

Assistant:

uint
WebAssemblyModule::GetGlobalsByteSize() const
{
    uint32 size = 0;
    for (Wasm::WasmTypes::WasmType type = (Wasm::WasmTypes::WasmType)(Wasm::WasmTypes::Void + 1); type < Wasm::WasmTypes::Limit; type = (Wasm::WasmTypes::WasmType)(type + 1))
    {
        if (!Wasm::WasmTypes::IsLocalType(type))
        {
            continue;
        }
        size = AddGlobalByteSizeToOffset(type, size);
    }
    return size;
}